

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

size_t mg_str_append(char **dst,char *end,char *src)

{
  size_t sVar1;
  size_t len;
  char *src_local;
  char *end_local;
  char **dst_local;
  
  sVar1 = strlen(src);
  if (*dst != end) {
    if (sVar1 < (ulong)((long)end - (long)*dst)) {
      strcpy(*dst,src);
      *dst = *dst + sVar1;
    }
    else {
      *dst = end;
    }
  }
  return sVar1;
}

Assistant:

static size_t
mg_str_append(char **dst, char *end, const char *src)
{
	size_t len = strlen(src);
	if (*dst != end) {
		/* Append src if enough space, or close dst. */
		if ((size_t)(end - *dst) > len) {
			strcpy(*dst, src);
			*dst += len;
		} else {
			*dst = end;
		}
	}
	return len;
}